

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_singleton.h
# Opt level: O2

object_t<_zes_perf_handle_t_*> * __thiscall
singleton_factory_t<object_t<_zes_perf_handle_t*>,_zes_perf_handle_t*>::
getInstance<_zes_perf_handle_t*&,dditable_t*&>
          (singleton_factory_t<object_t<_zes_perf_handle_t*>,_zes_perf_handle_t*> *this,
          _zes_perf_handle_t **_params,dditable_t **_params_1)

{
  _Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
  _Var1;
  object_t<_zes_perf_handle_t_*> *poVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false,_false>,_bool>
  pVar3;
  __single_object ptr;
  key_t key;
  unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>
  uStack_38;
  _zes_perf_handle_t *local_30;
  
  local_30 = *_params;
  if (local_30 == (_zes_perf_handle_t *)0x0) {
    poVar2 = (object_t<_zes_perf_handle_t_*> *)0x0;
  }
  else {
    std::mutex::lock((mutex *)this);
    _Var1._M_cur = (__node_type *)
                   std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)(this + 0x28),(key_type_conflict *)&local_30);
    if (_Var1._M_cur == (__node_type *)0x0) {
      std::make_unique<object_t<_zes_perf_handle_t*>,_zes_perf_handle_t*&,dditable_t*&>
                ((_zes_perf_handle_t **)&uStack_38,(dditable_t **)_params);
      pVar3 = std::
              _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::
              _M_emplace<unsigned_long&,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>
                        ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<object_t<_zes_perf_handle_t*>,std::default_delete<object_t<_zes_perf_handle_t*>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                          *)(this + 0x28),&local_30,&uStack_38);
      _Var1._M_cur = (__node_type *)
                     pVar3.first.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
                     ._M_cur;
      std::
      unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>
      ::~unique_ptr(&uStack_38);
    }
    poVar2 = *(object_t<_zes_perf_handle_t_*> **)
              ((long)&((_Var1._M_cur)->
                      super__Hash_node_value<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<const_unsigned_long,_std::unique_ptr<object_t<_zes_perf_handle_t_*>,_std::default_delete<object_t<_zes_perf_handle_t_*>_>_>_>_>
                      ._M_storage._M_storage + 8);
    pthread_mutex_unlock((pthread_mutex_t *)this);
  }
  return poVar2;
}

Assistant:

_singleton_t* getInstance( Ts&&... _params )
    {
        auto key = getKey( std::forward<Ts>( _params )... );

        if(key == 0) // No zero keys allowed in map
            return static_cast<_singleton_t*>(0);

        std::lock_guard<std::mutex> lk( mut );
        auto iter = map.find( key );

        if( map.end() == iter )
        {
            auto ptr = std::make_unique<singleton_t>( std::forward<Ts>( _params )... );
            iter = map.emplace( key, std::move( ptr ) ).first;
        }
        return iter->second.get();
    }